

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

void __thiscall cmMakefile::ExpandVariablesCMP0019(cmMakefile *this)

{
  _Hash_node_base *this_00;
  pointer *ppbVar1;
  pointer pcVar2;
  cmake *this_01;
  _Alloc_hider _Var3;
  bool bVar4;
  PolicyStatus PVar5;
  int iVar6;
  TargetType TVar7;
  cmValue cVar8;
  ostream *poVar9;
  string *psVar10;
  PolicyID id;
  size_type __rlen;
  pointer pbVar11;
  _Hash_node_base *p_Var12;
  string_view arg;
  string dirs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  linkLibs;
  string dirs_1;
  ios_base local_2b0 [264];
  ostringstream w;
  ios_base local_138 [264];
  
  PVar5 = cmStateSnapshot::GetPolicy(&this->StateSnapshot,CMP0019,false);
  if (PVar5 < NEW) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&w);
    dirs_1._M_dataplus._M_p = (pointer)&dirs_1.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&dirs_1,"INCLUDE_DIRECTORIES","");
    cVar8 = GetProperty(this,&dirs_1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)dirs_1._M_dataplus._M_p != &dirs_1.field_2) {
      operator_delete(dirs_1._M_dataplus._M_p,dirs_1.field_2._M_allocated_capacity + 1);
    }
    if ((cVar8.Value != (string *)0x0) &&
       (bVar4 = mightExpandVariablesCMP0019(((cVar8.Value)->_M_dataplus)._M_p), bVar4)) {
      pcVar2 = ((cVar8.Value)->_M_dataplus)._M_p;
      dirs._M_dataplus._M_p = (pointer)&dirs.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&dirs,pcVar2,pcVar2 + (cVar8.Value)->_M_string_length);
      ExpandVariablesInString(this,&dirs,true,true,false,(char *)0x0,-1,false,false);
      if ((PVar5 == WARN) &&
         ((dirs._M_string_length != (cVar8.Value)->_M_string_length ||
          ((dirs._M_string_length != 0 &&
           (iVar6 = bcmp(dirs._M_dataplus._M_p,((cVar8.Value)->_M_dataplus)._M_p,
                         dirs._M_string_length), iVar6 != 0)))))) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&w,"Evaluated directory INCLUDE_DIRECTORIES\n",0x28);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&w,"  ",2);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&w,((cVar8.Value)->_M_dataplus)._M_p,
                            (cVar8.Value)->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"as\n",3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"  ",2);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar9,dirs._M_dataplus._M_p,dirs._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
      }
      ppbVar1 = &linkLibs.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      linkLibs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&linkLibs,"INCLUDE_DIRECTORIES","");
      cmStateSnapshot::GetDirectory((cmStateDirectory *)&dirs_1,&this->StateSnapshot);
      cmStateDirectory::SetProperty
                ((cmStateDirectory *)&dirs_1,(string *)&linkLibs,&dirs,&this->Backtrace);
      if (linkLibs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar1) {
        operator_delete(linkLibs.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (ulong)((long)&((linkLibs.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                       _M_dataplus)._M_p + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)dirs._M_dataplus._M_p != &dirs.field_2) {
        operator_delete(dirs._M_dataplus._M_p,dirs.field_2._M_allocated_capacity + 1);
      }
    }
    p_Var12 = (this->Targets)._M_h._M_before_begin._M_nxt;
    if (p_Var12 != (_Hash_node_base *)0x0) {
      do {
        this_00 = p_Var12 + 5;
        TVar7 = cmTarget::GetType((cmTarget *)this_00);
        if ((TVar7 != INTERFACE_LIBRARY) &&
           (TVar7 = cmTarget::GetType((cmTarget *)this_00), TVar7 != GLOBAL_TARGET)) {
          dirs_1._M_dataplus._M_p = (pointer)&dirs_1.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&dirs_1,"INCLUDE_DIRECTORIES","");
          cVar8 = cmTarget::GetProperty((cmTarget *)this_00,&dirs_1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)dirs_1._M_dataplus._M_p != &dirs_1.field_2) {
            operator_delete(dirs_1._M_dataplus._M_p,dirs_1.field_2._M_allocated_capacity + 1);
          }
          if ((cVar8.Value != (string *)0x0) &&
             (bVar4 = mightExpandVariablesCMP0019(((cVar8.Value)->_M_dataplus)._M_p), bVar4)) {
            dirs_1._M_dataplus._M_p = (pointer)&dirs_1.field_2;
            pcVar2 = ((cVar8.Value)->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&dirs_1,pcVar2,pcVar2 + (cVar8.Value)->_M_string_length);
            ExpandVariablesInString(this,&dirs_1,true,true,false,(char *)0x0,-1,false,false);
            if ((PVar5 == WARN) &&
               ((dirs_1._M_string_length != (cVar8.Value)->_M_string_length ||
                ((dirs_1._M_string_length != 0 &&
                 (iVar6 = bcmp(dirs_1._M_dataplus._M_p,((cVar8.Value)->_M_dataplus)._M_p,
                               dirs_1._M_string_length), iVar6 != 0)))))) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&w,"Evaluated target ",0x11);
              psVar10 = cmTarget::GetName_abi_cxx11_((cmTarget *)this_00);
              poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&w,(psVar10->_M_dataplus)._M_p,
                                  psVar10->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar9," INCLUDE_DIRECTORIES\n",0x15);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,"  ",2);
              poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar9,((cVar8.Value)->_M_dataplus)._M_p,
                                  (cVar8.Value)->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,"as\n",3);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,"  ",2);
              poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar9,dirs_1._M_dataplus._M_p,dirs_1._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
            }
            dirs._M_dataplus._M_p = (pointer)&dirs.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&dirs,"INCLUDE_DIRECTORIES","");
            cmTarget::SetProperty((cmTarget *)this_00,&dirs,&dirs_1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)dirs._M_dataplus._M_p != &dirs.field_2) {
              operator_delete(dirs._M_dataplus._M_p,dirs.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)dirs_1._M_dataplus._M_p != &dirs_1.field_2) {
              operator_delete(dirs_1._M_dataplus._M_p,dirs_1.field_2._M_allocated_capacity + 1);
            }
          }
        }
        p_Var12 = p_Var12->_M_nxt;
      } while (p_Var12 != (_Hash_node_base *)0x0);
    }
    dirs_1._M_dataplus._M_p = (pointer)&dirs_1.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&dirs_1,"LINK_DIRECTORIES","");
    cVar8 = GetProperty(this,&dirs_1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)dirs_1._M_dataplus._M_p != &dirs_1.field_2) {
      operator_delete(dirs_1._M_dataplus._M_p,dirs_1.field_2._M_allocated_capacity + 1);
    }
    if ((cVar8.Value != (string *)0x0) &&
       (bVar4 = mightExpandVariablesCMP0019(((cVar8.Value)->_M_dataplus)._M_p), bVar4)) {
      dirs_1._M_dataplus._M_p = (pointer)&dirs_1.field_2;
      pcVar2 = ((cVar8.Value)->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&dirs_1,pcVar2,pcVar2 + (cVar8.Value)->_M_string_length);
      dirs._M_dataplus._M_p = (pointer)&dirs.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&dirs,dirs_1._M_dataplus._M_p,
                 dirs_1._M_dataplus._M_p + dirs_1._M_string_length);
      ExpandVariablesInString(this,&dirs_1,true,true,false,(char *)0x0,-1,false,false);
      if ((PVar5 == WARN) &&
         ((dirs_1._M_string_length != dirs._M_string_length ||
          ((dirs_1._M_string_length != 0 &&
           (iVar6 = bcmp(dirs_1._M_dataplus._M_p,dirs._M_dataplus._M_p,dirs_1._M_string_length),
           iVar6 != 0)))))) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&w,"Evaluated link directories\n",0x1b);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&w,"  ",2);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&w,dirs._M_dataplus._M_p,dirs._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"as\n",3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"  ",2);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar9,dirs_1._M_dataplus._M_p,dirs_1._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)dirs._M_dataplus._M_p != &dirs.field_2) {
        operator_delete(dirs._M_dataplus._M_p,dirs.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)dirs_1._M_dataplus._M_p != &dirs_1.field_2) {
        operator_delete(dirs_1._M_dataplus._M_p,dirs_1.field_2._M_allocated_capacity + 1);
      }
    }
    dirs_1._M_dataplus._M_p = (pointer)&dirs_1.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&dirs_1,"LINK_LIBRARIES","");
    cVar8 = GetProperty(this,&dirs_1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)dirs_1._M_dataplus._M_p != &dirs_1.field_2) {
      operator_delete(dirs_1._M_dataplus._M_p,dirs_1.field_2._M_allocated_capacity + 1);
    }
    if (cVar8.Value != (string *)0x0) {
      arg._M_str = ((cVar8.Value)->_M_dataplus)._M_p;
      arg._M_len = (cVar8.Value)->_M_string_length;
      cmExpandedList_abi_cxx11_(&linkLibs,arg,false);
      if (linkLibs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          linkLibs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pbVar11 = linkLibs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          dirs_1._M_dataplus._M_p = (pointer)&dirs_1.field_2;
          pcVar2 = (pbVar11->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&dirs_1,pcVar2,pcVar2 + pbVar11->_M_string_length);
          if (dirs_1._M_string_length == 5) {
            iVar6 = bcmp(dirs_1._M_dataplus._M_p,"debug",5);
joined_r0x001aa13f:
            if (iVar6 == 0) {
              pbVar11 = pbVar11 + 1;
              std::__cxx11::string::_M_assign((string *)&dirs_1);
            }
          }
          else if (dirs_1._M_string_length == 9) {
            iVar6 = bcmp(dirs_1._M_dataplus._M_p,"optimized",9);
            goto joined_r0x001aa13f;
          }
          _Var3._M_p = dirs_1._M_dataplus._M_p;
          bVar4 = mightExpandVariablesCMP0019(dirs_1._M_dataplus._M_p);
          if (bVar4) {
            dirs._M_dataplus._M_p = (pointer)&dirs.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&dirs,_Var3._M_p,_Var3._M_p + dirs_1._M_string_length);
            ExpandVariablesInString(this,&dirs_1,true,true,false,(char *)0x0,-1,false,false);
            if ((PVar5 == WARN) &&
               ((dirs_1._M_string_length != dirs._M_string_length ||
                ((dirs_1._M_string_length != 0 &&
                 (iVar6 = bcmp(dirs_1._M_dataplus._M_p,dirs._M_dataplus._M_p,dirs_1._M_string_length
                              ), iVar6 != 0)))))) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&w,"Evaluated link library\n",0x17);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&w,"  ",2);
              poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&w,dirs._M_dataplus._M_p,dirs._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,"as\n",3);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,"  ",2);
              poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar9,dirs_1._M_dataplus._M_p,dirs_1._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)dirs._M_dataplus._M_p != &dirs.field_2) {
              operator_delete(dirs._M_dataplus._M_p,dirs.field_2._M_allocated_capacity + 1);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)dirs_1._M_dataplus._M_p != &dirs_1.field_2) {
            operator_delete(dirs_1._M_dataplus._M_p,dirs_1.field_2._M_allocated_capacity + 1);
          }
          pbVar11 = pbVar11 + 1;
        } while (pbVar11 !=
                 linkLibs.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&linkLibs);
    }
    std::__cxx11::stringbuf::str();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)dirs_1._M_dataplus._M_p != &dirs_1.field_2) {
      operator_delete(dirs_1._M_dataplus._M_p,dirs_1.field_2._M_allocated_capacity + 1);
    }
    if (dirs_1._M_string_length != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&dirs_1);
      cmPolicies::GetPolicyWarning_abi_cxx11_(&dirs,(cmPolicies *)0x13,id);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&dirs_1,dirs._M_dataplus._M_p,dirs._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar9,"The following variable evaluations were encountered:\n",0x35);
      std::__cxx11::stringbuf::str();
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar9,(char *)linkLibs.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                 (long)linkLibs.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
      if (linkLibs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pointer)&linkLibs.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        operator_delete(linkLibs.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (ulong)((long)&((linkLibs.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                       _M_dataplus)._M_p + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)dirs._M_dataplus._M_p != &dirs.field_2) {
        operator_delete(dirs._M_dataplus._M_p,dirs.field_2._M_allocated_capacity + 1);
      }
      this_01 = this->GlobalGenerator->CMakeInstance;
      std::__cxx11::stringbuf::str();
      cmake::IssueMessage(this_01,AUTHOR_WARNING,&dirs,&this->Backtrace);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)dirs._M_dataplus._M_p != &dirs.field_2) {
        operator_delete(dirs._M_dataplus._M_p,dirs.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dirs_1);
      std::ios_base::~ios_base(local_2b0);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&w);
    std::ios_base::~ios_base(local_138);
  }
  return;
}

Assistant:

void cmMakefile::ExpandVariablesCMP0019()
{
  // Drop this ancient compatibility behavior with a policy.
  cmPolicies::PolicyStatus pol = this->GetPolicyStatus(cmPolicies::CMP0019);
  if (pol != cmPolicies::OLD && pol != cmPolicies::WARN) {
    return;
  }
  std::ostringstream w;

  cmValue includeDirs = this->GetProperty("INCLUDE_DIRECTORIES");
  if (includeDirs && mightExpandVariablesCMP0019(includeDirs->c_str())) {
    std::string dirs = *includeDirs;
    this->ExpandVariablesInString(dirs, true, true);
    if (pol == cmPolicies::WARN && dirs != *includeDirs) {
      /* clang-format off */
      w << "Evaluated directory INCLUDE_DIRECTORIES\n"
        << "  " << *includeDirs << "\n"
        << "as\n"
        << "  " << dirs << "\n";
      /* clang-format on */
    }
    this->SetProperty("INCLUDE_DIRECTORIES", dirs);
  }

  // Also for each target's INCLUDE_DIRECTORIES property:
  for (auto& target : this->Targets) {
    cmTarget& t = target.second;
    if (t.GetType() == cmStateEnums::INTERFACE_LIBRARY ||
        t.GetType() == cmStateEnums::GLOBAL_TARGET) {
      continue;
    }
    includeDirs = t.GetProperty("INCLUDE_DIRECTORIES");
    if (includeDirs && mightExpandVariablesCMP0019(includeDirs->c_str())) {
      std::string dirs = *includeDirs;
      this->ExpandVariablesInString(dirs, true, true);
      if (pol == cmPolicies::WARN && dirs != *includeDirs) {
        /* clang-format off */
        w << "Evaluated target " << t.GetName() << " INCLUDE_DIRECTORIES\n"
          << "  " << *includeDirs << "\n"
          << "as\n"
          << "  " << dirs << "\n";
        /* clang-format on */
      }
      t.SetProperty("INCLUDE_DIRECTORIES", dirs);
    }
  }

  if (cmValue linkDirsProp = this->GetProperty("LINK_DIRECTORIES")) {
    if (mightExpandVariablesCMP0019(linkDirsProp->c_str())) {
      std::string d = *linkDirsProp;
      const std::string orig = d;
      this->ExpandVariablesInString(d, true, true);
      if (pol == cmPolicies::WARN && d != orig) {
        /* clang-format off */
        w << "Evaluated link directories\n"
          << "  " << orig << "\n"
          << "as\n"
          << "  " << d << "\n";
        /* clang-format on */
      }
    }
  }

  if (cmValue linkLibsProp = this->GetProperty("LINK_LIBRARIES")) {
    std::vector<std::string> linkLibs = cmExpandedList(*linkLibsProp);

    for (auto l = linkLibs.begin(); l != linkLibs.end(); ++l) {
      std::string libName = *l;
      if (libName == "optimized"_s || libName == "debug"_s) {
        ++l;
        libName = *l;
      }
      if (mightExpandVariablesCMP0019(libName.c_str())) {
        const std::string orig = libName;
        this->ExpandVariablesInString(libName, true, true);
        if (pol == cmPolicies::WARN && libName != orig) {
          /* clang-format off */
        w << "Evaluated link library\n"
          << "  " << orig << "\n"
          << "as\n"
          << "  " << libName << "\n";
          /* clang-format on */
        }
      }
    }
  }

  if (!w.str().empty()) {
    std::ostringstream m;
    /* clang-format off */
    m << cmPolicies::GetPolicyWarning(cmPolicies::CMP0019)
      << "\n"
      << "The following variable evaluations were encountered:\n"
      << w.str();
    /* clang-format on */
    this->GetCMakeInstance()->IssueMessage(MessageType::AUTHOR_WARNING,
                                           m.str(), this->Backtrace);
  }
}